

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::BufferStorage::DynamicStorageTest::iterate(DynamicStorageTest *this)

{
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  MessageBuilder local_898;
  undefined1 local_718 [8];
  Buffer write_buffer_1;
  size_t i_1;
  GLubyte write_data_1 [64];
  GLubyte update_data_1 [64];
  GLubyte temp_data_1 [64];
  MessageBuilder local_4b8;
  GetNameFunc local_338;
  int local_330;
  GetNameFunc local_328;
  int local_320;
  string local_318;
  char *local_2f8;
  MessageBuilder local_2f0;
  GLenum local_170;
  GLenum error;
  undefined1 local_160 [8];
  Buffer write_buffer;
  Buffer read_buffer;
  size_t i;
  GLubyte write_data [64];
  GLubyte update_data [64];
  GLubyte temp_data [64];
  GLubyte read_data [64];
  bool local_19;
  bool test_result;
  Functions *gl;
  DynamicStorageTest *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  read_buffer.m_target = 0;
  read_buffer._20_4_ = 0;
  for (; (ulong)read_buffer._16_8_ < 0x40; read_buffer._16_8_ = read_buffer._16_8_ + 1) {
    temp_data[read_buffer._16_8_ + 0x38] = '\x01';
    update_data[read_buffer._16_8_ + 0x38] = '\0';
    write_data[read_buffer._16_8_ + 0x38] = '\x03';
    write_data[read_buffer._16_8_ + -8] = '\x02';
  }
  BufferStorage::Buffer::Buffer((Buffer *)&write_buffer.m_target,(this->super_TestCase).m_context);
  BufferStorage::Buffer::Buffer((Buffer *)local_160,(this->super_TestCase).m_context);
  BufferStorage::Buffer::InitStorage
            ((Buffer *)&write_buffer.m_target,0x8f36,0,0x40,temp_data + 0x38);
  BufferStorage::Buffer::InitStorage((Buffer *)local_160,0x8f37,0,0x40,&i);
  BufferStorage::Buffer::Bind((Buffer *)local_160);
  (*gl_00->bufferSubData)(0x8f37,0,0x40,write_data + 0x38);
  local_170 = (*gl_00->getError)();
  local_19 = local_170 != 0x502;
  if (local_19) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_2f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_2f0,
                        (char (*) [128])
                        "Invalid error was generated. BufferSubData was executed on store without DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
                       );
    EVar7 = glu::getErrorStr(local_170);
    local_338 = EVar7.m_getName;
    local_330 = EVar7.m_value;
    local_328 = local_338;
    local_320 = local_330;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_318,&local_328);
    local_2f8 = (char *)std::__cxx11::string::c_str();
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_2f8);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_318);
    tcu::MessageBuilder::~MessageBuilder(&local_2f0);
  }
  local_19 = !local_19;
  BufferStorage::Buffer::GetSubData(gl_00,0x8f37,0,0x40,update_data + 0x38);
  iVar1 = memcmp(update_data + 0x38,&i,0x40);
  if (iVar1 != 0) {
    local_19 = false;
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4b8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4b8,
                        (char (*) [70])
                        "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
  }
  BufferStorage::Buffer::Bind((Buffer *)&write_buffer.m_target);
  (*gl_00->copyBufferSubData)(0x8f36,0x8f37,0,0,0x40);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"CopyBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8c8);
  BufferStorage::Buffer::GetSubData(gl_00,0x8f37,0,0x40,update_data + 0x38);
  iVar1 = memcmp(update_data + 0x38,temp_data + 0x38,0x40);
  if (iVar1 != 0) {
    local_19 = false;
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<
              ((MessageBuilder *)(temp_data_1 + 0x38),pTVar5,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)(temp_data_1 + 0x38),
                        (char (*) [66])
                        "CopyBufferSubData stored invalid contents in write target buffer.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(temp_data_1 + 0x38));
  }
  BufferStorage::Buffer::~Buffer((Buffer *)local_160);
  BufferStorage::Buffer::~Buffer((Buffer *)&write_buffer.m_target);
  write_buffer_1.m_target = 0;
  write_buffer_1._20_4_ = 0;
  for (; (ulong)write_buffer_1._16_8_ < 0x40; write_buffer_1._16_8_ = write_buffer_1._16_8_ + 1) {
    update_data_1[write_buffer_1._16_8_ + 0x38] = '\0';
    write_data_1[write_buffer_1._16_8_ + 0x38] = '\x03';
    write_data_1[write_buffer_1._16_8_ + -8] = '\x02';
  }
  BufferStorage::Buffer::Buffer((Buffer *)local_718,(this->super_TestCase).m_context);
  BufferStorage::Buffer::InitStorage((Buffer *)local_718,0x8f37,0x100,0x40,&i_1);
  BufferStorage::Buffer::Bind((Buffer *)local_718);
  (*gl_00->bufferSubData)(0x8f37,0,0x40,write_data_1 + 0x38);
  GVar2 = (*gl_00->getError)();
  glu::checkError(GVar2,"BufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8f1);
  BufferStorage::Buffer::GetSubData(gl_00,0x8f37,0,0x40,update_data_1 + 0x38);
  iVar1 = memcmp(update_data_1 + 0x38,write_data_1 + 0x38,0x40);
  if (iVar1 != 0) {
    local_19 = false;
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_898,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_898,(char (*) [62])0x29ae4d9);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_898);
  }
  BufferStorage::Buffer::~Buffer((Buffer *)local_718);
  if (local_19) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DynamicStorageTest::iterate()
{
	static const size_t data_size = 64;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/*
	 * - prepare 64 bytes immutable buffer filled with value 1; Bind the buffer to
	 * COPY_READ_BUFFER;
	 * - prepare 64 bytes immutable buffer filled with value 2; Do not set
	 * DYNAMIC_STORAGE_BIT for <flags>; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; INVLIAD_OPERATION error should be generated;
	 * - inspect contents of buffer to verify it is filled with 2;
	 * - execute CopyBufferSubData to transfer data from COPY_READ_BUFFER to
	 * COPY_WRITE_BUFFER; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 1;
	 */
	{
		/* Prepare buffers */
		GLubyte read_data[data_size];
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			read_data[i]   = 1;
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer read_buffer(m_context);
		Buffer write_buffer(m_context);

		read_buffer.InitStorage(GL_COPY_READ_BUFFER, 0 /* flags */, data_size, read_data);
		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, 0 /* flags */, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);

		GLenum error = gl.getError();
		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Invalid error was generated. BufferSubData was executed on store without "
											"DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, write_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT."
				<< tcu::TestLog::EndMessage;
		}

		/* Check copyBufferSubData */
		read_buffer.Bind();
		gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0 /* readOffset */, 0 /* writeOffset */,
							 data_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CopyBufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, read_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "CopyBufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - delete buffer and create new one; This time <flags> should contain
	 * DYNAMIC_STORAGE_BIT; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 3;
	 */
	{
		/* Prepare buffers */
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer write_buffer(m_context);

		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, update_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "BufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}